

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O3

Music_Emu * new_kss_file(void)

{
  Music_Emu *this;
  
  this = (Music_Emu *)malloc(0x1b0);
  if (this != (Music_Emu *)0x0) {
    Music_Emu::Music_Emu(this);
    (this->super_Gme_File)._vptr_Gme_File = (_func_int **)&PTR__Music_Emu_008937f8;
    (this->super_Gme_File).type_ = &gme_kss_type_;
  }
  return this;
}

Assistant:

void Kss_Emu::update_gain()
{
	double g = gain() * 1.4;
	if ( scc_accessed )
		g *= 1.5;
	ay.volume( g );
	scc.volume( g );
	if ( sn )
		sn->volume( g );
}